

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie_test.cpp
# Opt level: O0

void __thiscall
adt_trie_test_DefaultConstructor_Test::TestBody(adt_trie_test_DefaultConstructor_Test *this)

{
  ulong uVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  ulong uVar8;
  AssertionResult gtest_ar_4;
  char *key_str;
  trie_key *key_1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *value_str;
  trie_value value_1;
  AssertionResult gtest_ar_1;
  trie_value value;
  trie_key key;
  size_t value_size;
  size_t key_size;
  size_t keys_size;
  trie_key *last_prefix;
  trie suffix_trie;
  vector prefixes;
  vector keys_copy;
  vector keys;
  trie t;
  size_t iterator;
  AssertionResult gtest_ar;
  int *in_stack_fffffffffffffdf0;
  int *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  AssertHelper local_160;
  Message local_158;
  int local_150;
  undefined4 local_14c;
  AssertionResult local_148;
  char *local_138;
  undefined8 *local_130;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_118;
  undefined4 local_114;
  AssertionResult local_110;
  AssertHelper local_100;
  Message local_f8;
  int local_f0;
  undefined4 local_ec;
  AssertionResult local_e8;
  int *local_d8;
  int *local_d0;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b8;
  undefined4 local_b4;
  AssertionResult local_b0;
  void *local_a0;
  void *local_98;
  size_t local_90;
  size_t local_88;
  ulong local_80;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  ulong local_48;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  uVar3 = log_policy_format_text();
  uVar4 = log_policy_schedule_sync();
  uVar5 = log_policy_storage_sequential();
  uVar6 = log_policy_stream_stdio(_stdout);
  local_20 = log_configure_impl("metacall",4,uVar3,uVar4,uVar5,uVar6);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar2) {
    testing::Message::Message(local_38);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10bc35);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
               ,0x4a,pcVar7);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10bc98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bcf0);
  local_50 = trie_create(hash_callback_str,comparable_callback_str);
  local_58 = vector_create(8);
  local_60 = 0;
  local_68 = vector_create(8);
  local_70 = 0;
  local_80 = 4;
  for (local_48 = 0; local_48 < local_80; local_48 = local_48 + 1) {
    local_88 = strlen(TestBody::keys_str[local_48]);
    local_88 = local_88 + 1;
    local_90 = strlen(TestBody::values_str[local_48]);
    local_90 = local_90 + 1;
    local_98 = malloc(local_88);
    local_a0 = malloc(local_90);
    memcpy(local_98,TestBody::keys_str[local_48],local_88);
    memcpy(local_a0,TestBody::values_str[local_48],local_90);
    vector_push_back(local_58,&local_98);
    local_b4 = 0;
    local_b8 = trie_insert(local_50,local_58,local_a0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
               in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
    if (!bVar2) {
      testing::Message::Message(&local_c0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10bf1e);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                 ,0x71,pcVar7);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      testing::Message::~Message((Message *)0x10bf7b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bfd0);
  }
  local_60 = vector_copy(local_58);
  for (local_48 = 0; local_48 < local_80; local_48 = local_48 + 1) {
    in_stack_fffffffffffffdf0 = (int *)trie_get(local_50,local_60);
    local_d8 = in_stack_fffffffffffffdf0;
    local_d0 = in_stack_fffffffffffffdf0;
    log_write_impl_va("metacall",0x7c,"TestBody",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                      ,0,"%zu -> %s",local_48);
    local_ec = 0;
    local_f0 = strcmp(TestBody::values_str[~local_48 + local_80],(char *)local_d8);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
               in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
    if (!bVar2) {
      testing::Message::Message(&local_f8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c169);
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                 ,0x7e,pcVar7);
      testing::internal::AssertHelper::operator=(&local_100,&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      testing::Message::~Message((Message *)0x10c1c6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c21b);
    vector_pop_back(local_60);
  }
  vector_destroy(local_60);
  local_78 = (undefined8 *)vector_back(local_58);
  local_114 = 0;
  local_118 = trie_prefixes(local_50,*local_78,local_68);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_110);
  if (!bVar2) {
    testing::Message::Message(&local_120);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c32b);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
               ,0x87,pcVar7);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message((Message *)0x10c388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c3e0);
  log_write_impl_va("metacall",0x89,"TestBody",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                    ,0,"cannonical path: ");
  for (local_48 = 0; uVar1 = local_48, uVar8 = vector_size(local_68), uVar1 < uVar8;
      local_48 = local_48 + 1) {
    local_130 = (undefined8 *)vector_at(local_68,local_48);
    local_138 = (char *)*local_130;
    log_write_impl_va("metacall",0x91,"TestBody",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                      ,0,"%s/",local_138);
    local_14c = 0;
    local_150 = strcmp(TestBody::keys_str[local_48],local_138);
    this_00 = &local_148;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
               &this_00->success_,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    in_stack_fffffffffffffe0f = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!(bool)in_stack_fffffffffffffe0f) {
      testing::Message::Message(&local_158);
      in_stack_fffffffffffffdf8 =
           (int *)testing::AssertionResult::failure_message((AssertionResult *)0x10c574);
      testing::internal::AssertHelper::AssertHelper
                (&local_160,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                 ,0x93,(char *)in_stack_fffffffffffffdf8);
      testing::internal::AssertHelper::operator=(&local_160,&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_160);
      testing::Message::~Message((Message *)0x10c5d1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c626);
  }
  vector_pop_back(local_58);
  local_78 = (undefined8 *)vector_back(local_58);
  local_70 = trie_suffixes(local_50,*local_78);
  trie_iterate(local_50,trie_iterator_cb_print,0);
  trie_iterate(local_70,trie_iterator_cb_print,0);
  trie_iterate(local_50,trie_iterator_cb_clear,0);
  vector_destroy(local_68);
  vector_destroy(local_58);
  trie_destroy(local_70);
  trie_destroy(local_50);
  return;
}

Assistant:

TEST_F(adt_trie_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	size_t iterator;

	static const char *keys_str[] = {
		"this", "is", "a", "path"
	};

	static const char *values_str[] = {
		"these", "are", "the", "values"
	};

	trie t = trie_create(&hash_callback_str, &comparable_callback_str);

	vector keys = vector_create(sizeof(trie_key));

	vector keys_copy = NULL;

	vector prefixes = vector_create(sizeof(trie_key));

	trie suffix_trie = NULL;

	trie_key *last_prefix;

	size_t keys_size = sizeof(keys_str) / sizeof(keys_str[0]);

	for (iterator = 0; iterator < keys_size; ++iterator)
	{
		size_t key_size = strlen(keys_str[iterator]) + 1;
		size_t value_size = strlen(values_str[iterator]) + 1;

		trie_key key = malloc(key_size);
		trie_value value = malloc(value_size);

		memcpy(key, keys_str[iterator], key_size);
		memcpy(value, values_str[iterator], value_size);

		vector_push_back(keys, &key);

		EXPECT_EQ((int)0, (int)trie_insert(t, keys, value));
	}

	keys_copy = vector_copy(keys);

	for (iterator = 0; iterator < keys_size; ++iterator)
	{
		trie_value value = trie_get(t, keys_copy);

		const char *value_str = reinterpret_cast<const char *>(value);

		log_write("metacall", LOG_LEVEL_DEBUG, "%" PRIuS " -> %s", iterator, value_str);

		EXPECT_EQ((int)0, (int)strcmp(values_str[keys_size - iterator - 1], value_str));

		vector_pop_back(keys_copy);
	}

	vector_destroy(keys_copy);

	last_prefix = reinterpret_cast<trie_key *>(vector_back(keys));

	EXPECT_EQ((int)0, (int)trie_prefixes(t, *last_prefix, prefixes));

	log_write("metacall", LOG_LEVEL_DEBUG, "cannonical path: ");

	for (iterator = 0; iterator < vector_size(prefixes); ++iterator)
	{
		trie_key *key = reinterpret_cast<trie_key *>(vector_at(prefixes, iterator));

		const char *key_str = reinterpret_cast<const char *>(*key);

		log_write("metacall", LOG_LEVEL_DEBUG, "%s/", key_str);

		EXPECT_EQ((int)0, (int)strcmp(keys_str[iterator], key_str));
	}

	vector_pop_back(keys);

	last_prefix = reinterpret_cast<trie_key *>(vector_back(keys));

	suffix_trie = trie_suffixes(t, *last_prefix);

	trie_iterate(t, &trie_iterator_cb_print, NULL);

	trie_iterate(suffix_trie, &trie_iterator_cb_print, NULL);

	trie_iterate(t, &trie_iterator_cb_clear, NULL);

	vector_destroy(prefixes);

	vector_destroy(keys);

	trie_destroy(suffix_trie);

	trie_destroy(t);
}